

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

Gia_Man_t * Gia_ManPerformMapping(Gia_Man_t *p,void *pp)

{
  undefined8 uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Gia_Man_t *pGVar4;
  
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar2 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar2 == 0)) ||
     (iVar2 = Gia_ManIsNormalized(p), iVar2 == 0)) {
    pGVar4 = Gia_ManPerformMappingInt(p,(If_Par_t *)pp);
    Gia_ManTransferTiming(pGVar4,p);
    pGVar3 = pGVar4;
    if (*(int *)((long)pp + 0xa8) != 0) {
      pGVar3 = Gia_ManDupHashMapping(pGVar4);
      Gia_ManTransferPacking(pGVar3,pGVar4);
      Gia_ManTransferTiming(pGVar3,pGVar4);
      Gia_ManStop(pGVar4);
    }
  }
  else {
    pGVar3 = Gia_ManDupUnnormalize(p);
    if (pGVar3 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
    Gia_ManTransferTiming(pGVar3,p);
    pGVar4 = Gia_ManPerformMappingInt(pGVar3,(If_Par_t *)pp);
    if (pGVar4 != pGVar3) {
      Gia_ManTransferTiming(pGVar4,pGVar3);
      Gia_ManStop(pGVar3);
    }
    pGVar3 = Gia_ManDupNormalize(pGVar4,*(int *)((long)pp + 0xa8));
    Gia_ManTransferMapping(pGVar3,pGVar4);
    Gia_ManTransferPacking(pGVar3,pGVar4);
    Gia_ManTransferTiming(pGVar3,pGVar4);
    Gia_ManStop(pGVar4);
    iVar2 = Gia_ManIsNormalized(pGVar3);
    if (iVar2 == 0) {
      __assert_fail("Gia_ManIsNormalized(pNew)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                    ,0x95a,"Gia_Man_t *Gia_ManPerformMapping(Gia_Man_t *, void *)");
    }
  }
  uVar1 = *(undefined8 *)((long)pp + 0x100);
  pGVar3->MappedArea = (int)(float)((ulong)uVar1 >> 0x20);
  pGVar3->MappedDelay = (int)(float)uVar1;
  return pGVar3;
}

Assistant:

Gia_Man_t * Gia_ManPerformMapping( Gia_Man_t * p, void * pp )
{
    Gia_Man_t * pNew;
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // mapping
        pNew = Gia_ManPerformMappingInt( p, (If_Par_t *)pp );
        if ( pNew != p )
        {
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, ((If_Par_t *)pp)->fHashMapping );
        Gia_ManTransferMapping( pNew, p );
        Gia_ManTransferPacking( pNew, p );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNew = Gia_ManPerformMappingInt( p, (If_Par_t *)pp );
        Gia_ManTransferTiming( pNew, p );
        if ( ((If_Par_t *)pp)->fHashMapping )
        {
            pNew = Gia_ManDupHashMapping( p = pNew );
            Gia_ManTransferPacking( pNew, p );
            Gia_ManTransferTiming( pNew, p );
            Gia_ManStop( p );
        }
    }
    pNew->MappedDelay = (int)((If_Par_t *)pp)->FinalDelay;
    pNew->MappedArea  = (int)((If_Par_t *)pp)->FinalArea;
    return pNew;
}